

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::InitializeLoop(cmCTestMultiProcessHandler *this)

{
  cmCTest *this_00;
  bool bVar1;
  uv_loop_t *puVar2;
  ostream *this_01;
  char *msg;
  uv_loop_ptr *this_02;
  string local_210 [32];
  ostringstream local_1f0 [8];
  ostringstream cmCTestLog_msg;
  function<void_(int)> local_68;
  anon_class_8_1_8991fb9c local_48;
  function<void_()> local_40;
  optional<cmUVJobServerClient> local_20;
  cmCTestMultiProcessHandler *local_10;
  cmCTestMultiProcessHandler *this_local;
  
  this_02 = &this->Loop;
  local_10 = this;
  ::cm::uv_loop_ptr::init(this_02,(EVP_PKEY_CTX *)0x0);
  puVar2 = ::cm::uv_loop_ptr::operator*(this_02);
  ::cm::uv_idle_ptr::init(&this->StartNextTestsOnIdle_,(EVP_PKEY_CTX *)puVar2);
  puVar2 = ::cm::uv_loop_ptr::operator*(this_02);
  ::cm::uv_timer_ptr::init(&this->StartNextTestsOnTimer_,(EVP_PKEY_CTX *)puVar2);
  puVar2 = ::cm::uv_loop_ptr::operator*(this_02);
  local_48.this = this;
  std::function<void()>::function<cmCTestMultiProcessHandler::InitializeLoop()::__0,void>
            ((function<void()> *)&local_40,&local_48);
  std::function<void_(int)>::function(&local_68,(nullptr_t)0x0);
  cmUVJobServerClient::Connect((cmUVJobServerClient *)&local_20,puVar2,&local_40,&local_68);
  std::optional<cmUVJobServerClient>::operator=(&this->JobServerClient,&local_20);
  std::optional<cmUVJobServerClient>::~optional(&local_20);
  std::function<void_(int)>::~function(&local_68);
  std::function<void_()>::~function(&local_40);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->JobServerClient);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    this_01 = std::operator<<((ostream *)local_1f0,"Connected to MAKE jobserver");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_00 = this->CTest;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0xb6,msg,false);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::ostringstream::~ostringstream(local_1f0);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::InitializeLoop()
{
  this->Loop.init();
  this->StartNextTestsOnIdle_.init(*this->Loop, this);
  this->StartNextTestsOnTimer_.init(*this->Loop, this);

  this->JobServerClient = cmUVJobServerClient::Connect(
    *this->Loop, /*onToken=*/[this]() { this->JobServerReceivedToken(); },
    /*onDisconnect=*/nullptr);
  if (this->JobServerClient) {
    cmCTestLog(this->CTest, OUTPUT,
               "Connected to MAKE jobserver" << std::endl);
  }
}